

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperUtils.c
# Opt level: O1

void Map_MappingExpandTruth(uint *uTruth,int nVars)

{
  uint uVar1;
  byte bVar2;
  
  if (nVars < 7) {
    if (nVars != 6) {
      if (nVars < 5) {
        bVar2 = (byte)(-1 << ((byte)nVars & 0x1f));
        uVar1 = Map_MappingExpandTruth_rec((*uTruth << (bVar2 & 0x1f)) >> (bVar2 & 0x1f),nVars);
        *uTruth = uVar1;
      }
      uTruth[1] = *uTruth;
    }
    return;
  }
  __assert_fail("nVars < 7",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperUtils.c"
                ,0x2a0,"void Map_MappingExpandTruth(unsigned int *, int)");
}

Assistant:

void Map_MappingExpandTruth( unsigned uTruth[2], int nVars )
{
    assert( nVars < 7 );
    if ( nVars == 6 )
        return;
    if ( nVars < 5 )
    {
        uTruth[0] &= MAP_MASK( (1<<nVars) );
        uTruth[0]  = Map_MappingExpandTruth_rec( uTruth[0], nVars );
    }
    uTruth[1] = uTruth[0];
}